

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.h
# Opt level: O1

size_t bitset_next_set_bits(bitset_t *bitset,size_t *buffer,size_t capacity,size_t *startfrom)

{
  uint64_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  uint64_t uVar5;
  ulong uVar6;
  
  if (capacity != 0) {
    uVar3 = *startfrom;
    sVar4 = uVar3 >> 6;
    if (sVar4 < bitset->arraysize) {
      puVar1 = bitset->array;
      uVar5 = (puVar1[sVar4] >> ((byte)uVar3 & 0x3f)) << ((byte)uVar3 & 0x3f);
      uVar3 = uVar3 & 0xffffffffffffffc0;
      uVar2 = 0;
      do {
        while (uVar5 == 0) {
          sVar4 = sVar4 + 1;
          uVar6 = uVar2;
          if (sVar4 == bitset->arraysize) goto LAB_0010fe6d;
          uVar3 = uVar3 + 0x40;
          uVar5 = puVar1[sVar4];
          if (capacity <= uVar2) goto LAB_0010fe6d;
        }
        uVar6 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        buffer[uVar2] = uVar6 | uVar3;
        uVar6 = uVar5 - 1;
        if (capacity - 1 == uVar2) {
          uVar6 = 0xffffffffffffffff;
        }
        uVar2 = uVar2 + 1;
        uVar5 = uVar5 & uVar6;
        uVar6 = capacity;
      } while (capacity != uVar2);
LAB_0010fe6d:
      if (uVar6 != 0) {
        *startfrom = buffer[uVar6 - 1];
      }
      return uVar6;
    }
  }
  return 0;
}

Assistant:

inline size_t bitset_next_set_bits(const bitset_t *bitset, size_t *buffer,
                                   size_t capacity, size_t *startfrom) {
    if (capacity == 0) return 0;  // sanity check
    size_t x = *startfrom / 64;
    if (x >= bitset->arraysize) {
        return 0;  // nothing more to iterate over
    }
    uint64_t w = bitset->array[x];
    // unset low bits inside the word less than *startfrom
    w &= ~((UINT64_C(1) << (*startfrom & 63)) - 1);
    size_t howmany = 0;
    size_t base = x << 6;
    while (howmany < capacity) {
        while (w != 0) {
            uint64_t t = w & (~w + 1);
            int r = roaring_trailing_zeroes(w);
            buffer[howmany++] = r + base;
            if (howmany == capacity) goto end;
            w ^= t;
        }
        x += 1;
        if (x == bitset->arraysize) {
            break;
        }
        base += 64;
        w = bitset->array[x];
    }
end:
    if (howmany > 0) {
        *startfrom = buffer[howmany - 1];
    }
    return howmany;
}